

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void I444ToARGBRow_SSSE3(uint8_t *y_buf,uint8_t *u_buf,uint8_t *v_buf,uint8_t *dst_argb,
                        YuvConstants *yuvconstants,int width)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  ushort uVar57;
  undefined1 auVar58 [14];
  undefined1 auVar59 [12];
  unkbyte10 Var60;
  undefined1 auVar61 [14];
  undefined1 auVar62 [12];
  unkbyte10 Var63;
  undefined3 uVar64;
  unkbyte9 Var65;
  unkbyte9 Var66;
  uint uVar67;
  undefined1 auVar68 [11];
  undefined5 uVar69;
  unkbyte9 Var70;
  uint6 uVar71;
  undefined1 auVar72 [13];
  unkbyte9 Var73;
  undefined1 auVar74 [15];
  undefined6 uVar75;
  undefined4 uVar76;
  undefined2 uVar77;
  long lVar78;
  int iVar79;
  undefined1 auVar80 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar110 [16];
  int width_local;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 uVar111;
  
  auVar3 = *(undefined1 (*) [16])yuvconstants->kUVToB;
  auVar4 = *(undefined1 (*) [16])yuvconstants->kUVToG;
  auVar5 = *(undefined1 (*) [16])yuvconstants->kUVToR;
  sVar33 = yuvconstants->kUVBiasB[0];
  sVar34 = yuvconstants->kUVBiasB[1];
  sVar35 = yuvconstants->kUVBiasB[2];
  sVar36 = yuvconstants->kUVBiasB[3];
  sVar37 = yuvconstants->kUVBiasB[4];
  sVar38 = yuvconstants->kUVBiasB[5];
  sVar39 = yuvconstants->kUVBiasB[6];
  sVar40 = yuvconstants->kUVBiasB[7];
  sVar41 = yuvconstants->kUVBiasG[0];
  sVar42 = yuvconstants->kUVBiasG[1];
  sVar43 = yuvconstants->kUVBiasG[2];
  sVar44 = yuvconstants->kUVBiasG[3];
  sVar45 = yuvconstants->kUVBiasG[4];
  sVar46 = yuvconstants->kUVBiasG[5];
  sVar47 = yuvconstants->kUVBiasG[6];
  sVar48 = yuvconstants->kUVBiasG[7];
  sVar49 = yuvconstants->kUVBiasR[0];
  sVar50 = yuvconstants->kUVBiasR[1];
  sVar51 = yuvconstants->kUVBiasR[2];
  sVar52 = yuvconstants->kUVBiasR[3];
  sVar53 = yuvconstants->kUVBiasR[4];
  sVar54 = yuvconstants->kUVBiasR[5];
  sVar55 = yuvconstants->kUVBiasR[6];
  sVar56 = yuvconstants->kUVBiasR[7];
  auVar6 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  lVar78 = (long)v_buf - (long)u_buf;
  do {
    uVar1 = *(ulong *)u_buf;
    uVar2 = *(undefined8 *)((long)u_buf + lVar78);
    u_buf = (uint8_t *)((long)u_buf + 8);
    auVar84._8_6_ = 0;
    auVar84._0_8_ = uVar1;
    auVar84[0xe] = (char)(uVar1 >> 0x38);
    auVar84[0xf] = (char)((ulong)uVar2 >> 0x38);
    auVar83._14_2_ = auVar84._14_2_;
    auVar83._8_5_ = 0;
    auVar83._0_8_ = uVar1;
    auVar83[0xd] = (char)((ulong)uVar2 >> 0x30);
    auVar82._13_3_ = auVar83._13_3_;
    auVar82._8_4_ = 0;
    auVar82._0_8_ = uVar1;
    auVar82[0xc] = (char)(uVar1 >> 0x30);
    auVar81._12_4_ = auVar82._12_4_;
    auVar81._8_3_ = 0;
    auVar81._0_8_ = uVar1;
    auVar81[0xb] = (char)((ulong)uVar2 >> 0x28);
    auVar80._11_5_ = auVar81._11_5_;
    auVar80._8_2_ = 0;
    auVar80._0_8_ = uVar1;
    auVar80[10] = (char)(uVar1 >> 0x28);
    auVar110._10_6_ = auVar80._10_6_;
    auVar110[8] = 0;
    auVar110._0_8_ = uVar1;
    auVar110[9] = (char)((ulong)uVar2 >> 0x20);
    auVar91._9_7_ = auVar110._9_7_;
    auVar91[8] = (char)(uVar1 >> 0x20);
    auVar91._0_8_ = uVar1;
    auVar101._8_8_ = auVar91._8_8_;
    auVar101[7] = (char)((ulong)uVar2 >> 0x18);
    auVar101[6] = (char)(uVar1 >> 0x18);
    auVar101[5] = (char)((ulong)uVar2 >> 0x10);
    auVar101[4] = (char)(uVar1 >> 0x10);
    auVar101[3] = (char)((ulong)uVar2 >> 8);
    auVar101[2] = (char)(uVar1 >> 8);
    auVar101[0] = (undefined1)uVar1;
    auVar101[1] = (char)uVar2;
    uVar1 = *(ulong *)y_buf;
    uVar111 = (undefined1)(uVar1 >> 0x38);
    auVar109._8_6_ = 0;
    auVar109._0_8_ = uVar1;
    auVar109[0xe] = uVar111;
    auVar109[0xf] = uVar111;
    uVar111 = (undefined1)(uVar1 >> 0x30);
    auVar108._14_2_ = auVar109._14_2_;
    auVar108._8_5_ = 0;
    auVar108._0_8_ = uVar1;
    auVar108[0xd] = uVar111;
    auVar107._13_3_ = auVar108._13_3_;
    auVar107._8_4_ = 0;
    auVar107._0_8_ = uVar1;
    auVar107[0xc] = uVar111;
    uVar111 = (undefined1)(uVar1 >> 0x28);
    auVar106._12_4_ = auVar107._12_4_;
    auVar106._8_3_ = 0;
    auVar106._0_8_ = uVar1;
    auVar106[0xb] = uVar111;
    auVar105._11_5_ = auVar106._11_5_;
    auVar105._8_2_ = 0;
    auVar105._0_8_ = uVar1;
    auVar105[10] = uVar111;
    uVar111 = (undefined1)(uVar1 >> 0x20);
    auVar104._10_6_ = auVar105._10_6_;
    auVar104[8] = 0;
    auVar104._0_8_ = uVar1;
    auVar104[9] = uVar111;
    auVar103._9_7_ = auVar104._9_7_;
    auVar103[8] = uVar111;
    auVar103._0_8_ = uVar1;
    uVar111 = (undefined1)(uVar1 >> 0x18);
    auVar102._8_8_ = auVar103._8_8_;
    auVar102[7] = uVar111;
    auVar102[6] = uVar111;
    uVar111 = (undefined1)(uVar1 >> 0x10);
    auVar102[5] = uVar111;
    auVar102[4] = uVar111;
    uVar111 = (undefined1)(uVar1 >> 8);
    auVar102[3] = uVar111;
    auVar102[2] = uVar111;
    auVar102[0] = (undefined1)uVar1;
    auVar102[1] = auVar102[0];
    y_buf = (uint8_t *)((long)y_buf + 8);
    auVar91 = pmaddubsw(auVar101,auVar3);
    auVar85._0_2_ = sVar33 - auVar91._0_2_;
    auVar85._2_2_ = sVar34 - auVar91._2_2_;
    auVar85._4_2_ = sVar35 - auVar91._4_2_;
    auVar85._6_2_ = sVar36 - auVar91._6_2_;
    auVar85._8_2_ = sVar37 - auVar91._8_2_;
    auVar85._10_2_ = sVar38 - auVar91._10_2_;
    auVar85._12_2_ = sVar39 - auVar91._12_2_;
    auVar85._14_2_ = sVar40 - auVar91._14_2_;
    auVar91 = pmaddubsw(auVar101,auVar4);
    auVar92._0_2_ = sVar41 - auVar91._0_2_;
    auVar92._2_2_ = sVar42 - auVar91._2_2_;
    auVar92._4_2_ = sVar43 - auVar91._4_2_;
    auVar92._6_2_ = sVar44 - auVar91._6_2_;
    auVar92._8_2_ = sVar45 - auVar91._8_2_;
    auVar92._10_2_ = sVar46 - auVar91._10_2_;
    auVar92._12_2_ = sVar47 - auVar91._12_2_;
    auVar92._14_2_ = sVar48 - auVar91._14_2_;
    auVar101 = pmaddubsw(auVar101,auVar5);
    auVar93._0_2_ = sVar49 - auVar101._0_2_;
    auVar93._2_2_ = sVar50 - auVar101._2_2_;
    auVar93._4_2_ = sVar51 - auVar101._4_2_;
    auVar93._6_2_ = sVar52 - auVar101._6_2_;
    auVar93._8_2_ = sVar53 - auVar101._8_2_;
    auVar93._10_2_ = sVar54 - auVar101._10_2_;
    auVar93._12_2_ = sVar55 - auVar101._12_2_;
    auVar93._14_2_ = sVar56 - auVar101._14_2_;
    auVar110 = pmulhuw(auVar102,auVar6);
    auVar101 = paddsw(auVar85,auVar110);
    auVar91 = paddsw(auVar92,auVar110);
    auVar110 = paddsw(auVar93,auVar110);
    auVar101 = psraw(auVar101,6);
    auVar91 = psraw(auVar91,6);
    auVar110 = psraw(auVar110,6);
    sVar10 = auVar101._0_2_;
    sVar12 = auVar101._2_2_;
    sVar15 = auVar101._4_2_;
    sVar18 = auVar101._6_2_;
    sVar21 = auVar101._8_2_;
    sVar24 = auVar101._10_2_;
    sVar27 = auVar101._12_2_;
    sVar30 = auVar101._14_2_;
    cVar8 = (0 < sVar30) * (sVar30 < 0x100) * auVar101[0xe] - (0xff < sVar30);
    sVar30 = auVar91._0_2_;
    sVar13 = auVar91._2_2_;
    sVar16 = auVar91._4_2_;
    sVar19 = auVar91._6_2_;
    sVar22 = auVar91._8_2_;
    sVar25 = auVar91._10_2_;
    sVar28 = auVar91._12_2_;
    sVar31 = auVar91._14_2_;
    sVar11 = auVar110._0_2_;
    sVar14 = auVar110._2_2_;
    sVar17 = auVar110._4_2_;
    sVar20 = auVar110._6_2_;
    sVar23 = auVar110._8_2_;
    sVar26 = auVar110._10_2_;
    sVar29 = auVar110._12_2_;
    sVar32 = auVar110._14_2_;
    cVar9 = (0 < sVar32) * (sVar32 < 0x100) * auVar110[0xe] - (0xff < sVar32);
    uVar57 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar110[0] - (0xff < sVar11),cVar9);
    auVar97._0_9_ = (unkuint9)uVar57 << 0x38;
    uVar64 = CONCAT12((0 < sVar14) * (sVar14 < 0x100) * auVar110[2] - (0xff < sVar14),uVar57);
    uVar67 = CONCAT13((0 < sVar17) * (sVar17 < 0x100) * auVar110[4] - (0xff < sVar17),uVar64);
    auVar68._4_7_ = 0;
    auVar68._0_4_ = uVar67;
    auVar98._0_11_ = auVar68 << 0x38;
    uVar69 = CONCAT14((0 < sVar20) * (sVar20 < 0x100) * auVar110[6] - (0xff < sVar20),uVar67);
    uVar71 = CONCAT15((0 < sVar23) * (sVar23 < 0x100) * auVar110[8] - (0xff < sVar23),uVar69);
    auVar72._6_7_ = 0;
    auVar72._0_6_ = uVar71;
    auVar99._0_13_ = auVar72 << 0x38;
    auVar74[6] = (0 < sVar26) * (sVar26 < 0x100) * auVar110[10] - (0xff < sVar26);
    auVar74._0_6_ = uVar71;
    uVar77 = CONCAT11((0 < sVar31) * (sVar31 < 0x100) * auVar91[0xe] - (0xff < sVar31),cVar8);
    uVar76 = CONCAT31(CONCAT21(uVar77,(0 < sVar28) * (sVar28 < 0x100) * auVar91[0xc] -
                                      (0xff < sVar28)),
                      (0 < sVar27) * (sVar27 < 0x100) * auVar101[0xc] - (0xff < sVar27));
    uVar75 = CONCAT51(CONCAT41(uVar76,(0 < sVar25) * (sVar25 < 0x100) * auVar91[10] -
                                      (0xff < sVar25)),
                      (0 < sVar24) * (sVar24 < 0x100) * auVar101[10] - (0xff < sVar24));
    Var65 = CONCAT72(CONCAT61(uVar75,(0 < sVar22) * (sVar22 < 0x100) * auVar91[8] - (0xff < sVar22))
                     ,CONCAT11((0 < sVar21) * (sVar21 < 0x100) * auVar101[8] - (0xff < sVar21),cVar8
                              ));
    Var60 = CONCAT91(CONCAT81((long)((unkuint9)Var65 >> 8),
                              (0 < sVar19) * (sVar19 < 0x100) * auVar91[6] - (0xff < sVar19)),
                     (0 < sVar18) * (sVar18 < 0x100) * auVar101[6] - (0xff < sVar18));
    auVar59._2_10_ = Var60;
    auVar59[1] = (0 < sVar16) * (sVar16 < 0x100) * auVar91[4] - (0xff < sVar16);
    auVar59[0] = (0 < sVar15) * (sVar15 < 0x100) * auVar101[4] - (0xff < sVar15);
    auVar58._2_12_ = auVar59;
    auVar58[1] = (0 < sVar13) * (sVar13 < 0x100) * auVar91[2] - (0xff < sVar13);
    auVar58[0] = (0 < sVar12) * (sVar12 < 0x100) * auVar101[2] - (0xff < sVar12);
    auVar86._0_2_ =
         CONCAT11((0 < sVar30) * (sVar30 < 0x100) * auVar91[0] - (0xff < sVar30),
                  (0 < sVar10) * (sVar10 < 0x100) * auVar101[0] - (0xff < sVar10));
    auVar86._2_14_ = auVar58;
    auVar74[7] = cVar9;
    auVar74._8_7_ = 0;
    auVar100._0_15_ = auVar74 << 0x38;
    auVar100[0xf] = 0xff;
    auVar99._14_2_ = auVar100._14_2_;
    auVar99[0xd] = 0xff;
    Var73 = CONCAT36(auVar99._13_3_,
                     CONCAT15((0 < sVar29) * (sVar29 < 0x100) * auVar110[0xc] - (0xff < sVar29),
                              uVar69));
    auVar98._12_4_ = (undefined4)((unkuint9)Var73 >> 0x28);
    auVar98[0xb] = 0xff;
    Var70 = CONCAT54(auVar98._11_5_,
                     CONCAT13((0 < sVar26) * (sVar26 < 0x100) * auVar110[10] - (0xff < sVar26),
                              uVar64));
    auVar97._10_6_ = (undefined6)((unkuint9)Var70 >> 0x18);
    auVar97[9] = 0xff;
    Var66 = CONCAT72(auVar97._9_7_,
                     CONCAT11((0 < sVar23) * (sVar23 < 0x100) * auVar110[8] - (0xff < sVar23),cVar9)
                    );
    auVar96._8_8_ = (undefined8)((unkuint9)Var66 >> 8);
    auVar96._0_8_ = 0xff00000000000000;
    Var63 = CONCAT91(auVar96._7_9_,(0 < sVar20) * (sVar20 < 0x100) * auVar110[6] - (0xff < sVar20));
    auVar95._6_10_ = Var63;
    auVar95._0_6_ = 0xff0000000000;
    auVar62._1_11_ = auVar95._5_11_;
    auVar62[0] = (0 < sVar17) * (sVar17 < 0x100) * auVar110[4] - (0xff < sVar17);
    auVar94._4_12_ = auVar62;
    auVar94._0_4_ = 0xff000000;
    auVar61._1_13_ = auVar94._3_13_;
    auVar61[0] = (0 < sVar14) * (sVar14 < 0x100) * auVar110[2] - (0xff < sVar14);
    auVar87[3] = 0xff;
    auVar87[2] = (0 < sVar11) * (sVar11 < 0x100) * auVar110[0] - (0xff < sVar11);
    auVar90._0_12_ = auVar86._0_12_;
    auVar90._12_2_ = (short)Var60;
    auVar90._14_2_ = (short)Var63;
    auVar89._12_4_ = auVar90._12_4_;
    auVar89._0_10_ = auVar86._0_10_;
    auVar89._10_2_ = auVar62._0_2_;
    auVar88._10_6_ = auVar89._10_6_;
    auVar88._0_8_ = auVar86._0_8_;
    auVar88._8_2_ = auVar59._0_2_;
    auVar87._8_8_ = auVar88._8_8_;
    auVar87._6_2_ = auVar61._0_2_;
    auVar87._4_2_ = auVar58._0_2_;
    auVar87._0_2_ = auVar86._0_2_;
    *(undefined1 (*) [16])dst_argb = auVar87;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x10) = (short)((unkuint9)Var65 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 2) = (short)((unkuint9)Var66 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 4) = (short)uVar75;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 6) = (short)((unkuint9)Var70 >> 0x18)
    ;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 8) = (short)uVar76;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 10) =
         (short)((unkuint9)Var73 >> 0x28);
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xc) = uVar77;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xe) = auVar99._14_2_;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar79 = width + -8;
    bVar7 = 7 < width;
    width = iVar79;
  } while (iVar79 != 0 && bVar7);
  return;
}

Assistant:

void OMITFP I444ToARGBRow_SSSE3(const uint8_t* y_buf,
                                const uint8_t* u_buf,
                                const uint8_t* v_buf,
                                uint8_t* dst_argb,
                                const struct YuvConstants* yuvconstants,
                                int width) {
  asm volatile (
    YUVTORGB_SETUP(yuvconstants)
      "sub         %[u_buf],%[v_buf]             \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"

    LABELALIGN
      "1:                                        \n"
    READYUV444
    YUVTORGB(yuvconstants)
    STOREARGB
      "sub         $0x8,%[width]                 \n"
      "jg          1b                            \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [dst_argb]"+r"(dst_argb),  // %[dst_argb]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
  : "memory", "cc", YUVTORGB_REGS
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
}